

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O0

SUNErrCode SUNMatHermitianTransposeVec_Dense(SUNMatrix A,N_Vector x,N_Vector y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  sunindextype j;
  sunrealtype *row_i;
  sunindextype i_1;
  sunindextype i;
  sunrealtype *yd;
  sunrealtype *xd;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_50;
  undefined8 local_40;
  undefined8 local_38;
  
  lVar2 = N_VGetArrayPointer(in_RSI);
  lVar3 = N_VGetArrayPointer(in_RDX);
  for (local_38 = 0; local_38 < *(long *)(*in_RDI + 8); local_38 = local_38 + 1) {
    *(undefined8 *)(lVar3 + local_38 * 8) = 0;
  }
  for (local_40 = 0; local_40 < *(long *)(*in_RDI + 8); local_40 = local_40 + 1) {
    lVar1 = *(long *)(*(long *)(*in_RDI + 0x20) + local_40 * 8);
    for (local_50 = 0; local_50 < *(long *)*in_RDI; local_50 = local_50 + 1) {
      *(double *)(lVar3 + local_40 * 8) =
           *(double *)(lVar1 + local_50 * 8) * *(double *)(lVar2 + local_50 * 8) +
           *(double *)(lVar3 + local_40 * 8);
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatHermitianTransposeVec_Dense(SUNMatrix A, N_Vector x, N_Vector y)
{
  SUNFunctionBegin(A->sunctx);

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrixAndVectors(A, y, x), SUN_ERR_ARG_DIMSMISMATCH);

  /* access vector data (return if NULL data pointers) */
  sunrealtype *xd, *yd;
  xd = N_VGetArrayPointer(x);
  SUNCheckLastErr();
  yd = N_VGetArrayPointer(y);
  SUNCheckLastErr();

  SUNAssert(xd, SUN_ERR_MEM_FAIL);
  SUNAssert(yd, SUN_ERR_MEM_FAIL);
  SUNAssert(xd != yd, SUN_ERR_MEM_FAIL);

  /* Perform operation y = A^T x */
  for (sunindextype i = 0; i < SM_COLUMNS_D(A); i++) { yd[i] = ZERO; }
  for (sunindextype i = 0; i < SM_COLUMNS_D(A); i++)
  {
    sunrealtype* row_i = SM_COLUMN_D(A, i);
    for (sunindextype j = 0; j < SM_ROWS_D(A); j++)
    {
      yd[i] += row_i[j] * xd[j];
    }
  }
  return SUN_SUCCESS;
}